

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this)

{
  long lVar1;
  uint32_t i;
  ulong uVar2;
  
  lVar1 = 8;
  for (uVar2 = 0; uVar2 < this->size; uVar2 = uVar2 + 1) {
    deleteAllocatedObjects((Type *)((long)&this->items->repetitions + lVar1));
    lVar1 = lVar1 + 0x28;
  }
  anon_unknown_11::freeBytes(this->allocator,this->items);
  return;
}

Assistant:

~AllocatedVector() noexcept
    {
        for (decltype (size) i = 0; i < size; ++i)
            items[i].~ObjectType();

        freeBytes (allocator, items);
    }